

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O3

int param_missing_gost_ec(EVP_PKEY *pk)

{
  uint uVar1;
  EC_KEY *key;
  EC_GROUP *pEVar2;
  
  key = (EC_KEY *)EVP_PKEY_get0((EVP_PKEY *)pk);
  if (key == (EC_KEY *)0x0) {
    uVar1 = 1;
  }
  else {
    pEVar2 = EC_KEY_get0_group(key);
    uVar1 = (uint)(pEVar2 == (EC_GROUP *)0x0);
  }
  return uVar1;
}

Assistant:

static int param_missing_gost_ec(const EVP_PKEY *pk)
{
    const EC_KEY *ec = EVP_PKEY_get0((EVP_PKEY *)pk);
    if (!ec)
        return 1;
    if (!EC_KEY_get0_group(ec))
        return 1;
    return 0;
}